

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O1

string * __thiscall
Utils::ArgOption<float>::get_message_abi_cxx11_
          (string *__return_storage_ptr__,ArgOption<float> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  string *__return_storage_ptr___00;
  ArgOption<float> *this_00;
  long *plVar4;
  size_type *psVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> o;
  string opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string *local_40;
  ArgOption<float> *local_38;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"\x1b[1m","");
  pbVar6 = (this->opts).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->opts).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  if (pbVar6 != pbVar2) {
    paVar1 = &local_c0.field_2;
    do {
      pcVar3 = (pbVar6->_M_dataplus)._M_p;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar3,pcVar3 + pbVar6->_M_string_length);
      if (local_a0._M_string_length == 1) {
        std::operator+(&local_80,"-",&local_a0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_c0.field_2._M_allocated_capacity = *psVar5;
          local_c0.field_2._8_8_ = plVar4[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar5;
          local_c0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_c0._M_dataplus._M_p);
      }
      else {
        std::operator+(&local_80,"--",&local_a0);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_80);
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_c0.field_2._M_allocated_capacity = *psVar5;
          local_c0.field_2._8_8_ = plVar4[3];
          local_c0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_c0.field_2._M_allocated_capacity = *psVar5;
          local_c0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_c0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar2);
  }
  this_00 = local_38;
  std::operator+(&local_c0,"<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(local_38->super_TypedArgObj<float>).field_0x8);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_a0.field_2._M_allocated_capacity = *psVar5;
    local_a0.field_2._8_8_ = plVar4[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar5;
    local_a0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_a0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_a0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr___00 = local_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  ArgObject::argument_message(__return_storage_ptr___00,(ArgObject *)this_00,&local_60,8,0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr___00;
}

Assistant:

const std::string get_message() {
        std::string opt("\e[1m");
        for (auto o : opts) {
            if (o.size() == 1) opt += "-"  + o + " ";
            else               opt += "--" + o + " ";
        }
        opt += "<" + this->get_name() + ">\e[0m";
        return this->argument_message(opt,8,80);
    }